

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeTFBase::checkResults
          (TextureCubeMapArrayTextureSizeTFBase *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  char **local_438;
  char **local_390;
  uint local_364;
  MessageBuilder local_360;
  uint local_1e0 [4];
  MessageBuilder local_1d0;
  GLboolean local_49;
  GLuint GStack_48;
  STORAGE_TYPE SStack_44;
  GLboolean test_passed;
  GLuint read_size [6];
  GLuint *temp_buff;
  Functions *gl;
  STORAGE_TYPE storType_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  TextureCubeMapArrayTextureSizeTFBase *this_local;
  long lVar4;
  
  storType_local = height;
  depth_local = width;
  _height_local = this;
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)
  ;
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  read_size._16_8_ = (**(code **)(lVar4 + 0xd00))(0x8c8e,0,0x18,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error mapping buffer object\'s data store to client\'s address space.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x1dd);
  _GStack_48 = *(undefined8 *)read_size._16_8_;
  read_size._0_8_ = *(undefined8 *)(read_size._16_8_ + 8);
  read_size._8_8_ = *(undefined8 *)(read_size._16_8_ + 0x10);
  (**(code **)(lVar4 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Error ummapping transform feedback buffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x1e4);
  local_49 = '\x01';
  if (((GStack_48 != depth_local) || (SStack_44 != storType_local)) || (read_size[0] != depth / 6))
  {
    pTVar5 = tcu::TestNode::getTestContext((TestNode *)this);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1d0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [15])"Storage Type: ");
    if (storType == ST_MUTABLE) {
      local_390 = (char **)&mutableStorage;
    }
    else {
      local_390 = &imMutableStorage;
    }
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_390);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [99])
                               "textureSize() for samplerCubeArray returned wrong values. [width][height][layers]. They are equal "
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xffffffffffffffb8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xffffffffffffffbc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,read_size);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] but should be ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&depth_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&storType_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    local_1e0[0] = depth / 6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1e0);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    local_49 = '\0';
  }
  if (((read_size[1] != depth_local) || (read_size[2] != storType_local)) ||
     (read_size[3] != depth / 6)) {
    pTVar5 = tcu::TestNode::getTestContext((TestNode *)this);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_360,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [15])"Storage Type: ");
    if (storType == ST_MUTABLE) {
      local_438 = (char **)&mutableStorage;
    }
    else {
      local_438 = &imMutableStorage;
    }
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_438);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [105])
                               "textureSize() for samplerCubeArrayShadow returned wrong values. [width][height][layers]. They are equal "
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,read_size + 1);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,read_size + 2);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,read_size + 3);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"] but should be ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c316fc);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&depth_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&storType_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"][");
    local_364 = depth / 6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_364);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    local_49 = '\0';
  }
  return local_49;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeTFBase::checkResults(glw::GLuint width, glw::GLuint height,
																  glw::GLuint depth, STORAGE_TYPE storType)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Read results from transform feedback */
	glw::GLuint* temp_buff = (glw::GLuint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_n_varyings * m_n_tf_components * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client's address space.");

	/* Copy results to helper buffer */
	glw::GLuint read_size[m_n_varyings * m_n_tf_components];
	memcpy(read_size, temp_buff, m_n_varyings * m_n_tf_components * sizeof(glw::GLint));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping transform feedback buffer.");

	glw::GLboolean test_passed = true;

	/* Elements under index 0-2 contain result of textureSize called for samplerCubeArray sampler */
	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage) << "\n"
			<< "textureSize() for samplerCubeArray returned wrong values. [width][height][layers]. They are equal "
			<< "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2] << "] but should be "
			<< "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
			<< tcu::TestLog::EndMessage;
		test_passed = false;
	}

	/* Elements under index 3-5 contain result of textureSize called for samplerCubeArrayShadow sampler */
	if (read_size[3] != width || read_size[4] != height || read_size[5] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog() << tcu::TestLog::Message
								  << "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage)
								  << "\n"
								  << "textureSize() for samplerCubeArrayShadow returned wrong values. "
									 "[width][height][layers]. They are equal "
								  << "[" << read_size[3] << "][" << read_size[4] << "][" << read_size[5]
								  << "] but should be "
								  << "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
								  << tcu::TestLog::EndMessage;
		test_passed = false;
	}

	return test_passed;
}